

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::
concat<kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>,kj::StringPtr&,kj::CappedArray<char,17ul>>
          (String *__return_storage_ptr__,_ *this,
          Delimited<kj::ArrayPtr<const_unsigned_char>_> *params,StringPtr *params_1,
          CappedArray<char,_17UL> *params_2)

{
  uchar *__src;
  char *__n;
  size_t sVar1;
  char *pcVar2;
  
  sVar1 = Delimited<kj::ArrayPtr<const_unsigned_char>_>::size
                    ((Delimited<kj::ArrayPtr<const_unsigned_char>_> *)this);
  heapString(__return_storage_ptr__,
             (size_t)((params_1->content).ptr + sVar1 + (params->array).size_ + -1));
  pcVar2 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar2 != (char *)0x0) {
    pcVar2 = (__return_storage_ptr__->content).ptr;
  }
  pcVar2 = Delimited<kj::ArrayPtr<const_unsigned_char>_>::flattenTo
                     ((Delimited<kj::ArrayPtr<const_unsigned_char>_> *)this,pcVar2);
  __src = (params->array).ptr;
  sVar1 = (params->array).size_;
  if (__src != __src + (sVar1 - 1)) {
    memcpy(pcVar2,__src,sVar1 - 1);
    pcVar2 = pcVar2 + (sVar1 - 1);
  }
  __n = (params_1->content).ptr;
  if (__n != (char *)0x0) {
    memcpy(pcVar2,&(params_1->content).size_,(size_t)__n);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}